

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O2

void Ntk_SymFunGenerate(int nVars,int fVerbose)

{
  word **__ptr;
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *pComp;
  Vec_Mem_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  ulong uVar6;
  word *pFun;
  size_t sVar7;
  word *pwVar8;
  int *piVar9;
  uint *puVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int i;
  int iVar16;
  long lVar17;
  uint uVar18;
  bool bVar19;
  ulong local_130;
  int local_128;
  word **local_110;
  word **local_d0;
  char Ones [100];
  
  pComp = Extra_GreyCodeSchedule(nVars);
  bVar2 = (byte)nVars;
  iVar15 = 1 << (bVar2 - 6 & 0x1f);
  if (nVars < 7) {
    iVar15 = 1;
  }
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = iVar15;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  iVar4 = Abc_PrimeCudd(10000);
  p_00 = Vec_IntAlloc(iVar4);
  p_00->nSize = iVar4;
  if (p_00->pArray != (int *)0x0) {
    memset(p_00->pArray,0xff,(long)iVar4 << 2);
  }
  p->vTable = p_00;
  p_01 = Vec_IntAlloc(10000);
  p->vNexts = p_01;
  if (nVars - 0x11U < 0xfffffff0) {
    __assert_fail("!(nVars < 1 || nVars > 16)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSymm.c"
                  ,0x13a,"void Ntk_SymFunGenerate(int, int)");
  }
  printf("Generating truth tables of all symmetric functions of %d variables.\n",(ulong)(uint)nVars)
  ;
  iVar4 = 2;
  if (nVars != 1) {
    iVar4 = nVars;
  }
  iVar13 = 3;
  if (iVar4 != 2) {
    iVar13 = iVar4;
  }
  local_128 = -1;
  local_d0 = (word **)0x0;
  local_110 = (word **)0x0;
  iVar1 = 0;
  local_130 = 0;
  uVar18 = 0;
  do {
    if (uVar18 == 2 << (bVar2 & 0x1f)) {
      lVar17 = 0;
      printf("The number of different NPN classes is %d.\n",local_130);
      Vec_IntFreeP(&p->vTable);
      Vec_IntFreeP(&p->vNexts);
      __ptr = p->ppPages;
      iVar15 = -1;
      if (-1 < p->iPage) {
        iVar15 = p->iPage;
      }
      for (; (long)iVar15 + 1 != lVar17; lVar17 = lVar17 + 1) {
        if (__ptr[lVar17] != (word *)0x0) {
          free(__ptr[lVar17]);
          __ptr[lVar17] = (word *)0x0;
        }
      }
      free(__ptr);
      free(p);
      free(pComp);
      return;
    }
    Ones[0x50] = '\0';
    Ones[0x51] = '\0';
    Ones[0x52] = '\0';
    Ones[0x53] = '\0';
    Ones[0x54] = '\0';
    Ones[0x55] = '\0';
    Ones[0x56] = '\0';
    Ones[0x57] = '\0';
    Ones[0x58] = '\0';
    Ones[0x59] = '\0';
    Ones[0x5a] = '\0';
    Ones[0x5b] = '\0';
    Ones[0x5c] = '\0';
    Ones[0x5d] = '\0';
    Ones[0x5e] = '\0';
    Ones[0x5f] = '\0';
    Ones[0x40] = '\0';
    Ones[0x41] = '\0';
    Ones[0x42] = '\0';
    Ones[0x43] = '\0';
    Ones[0x44] = '\0';
    Ones[0x45] = '\0';
    Ones[0x46] = '\0';
    Ones[0x47] = '\0';
    Ones[0x48] = '\0';
    Ones[0x49] = '\0';
    Ones[0x4a] = '\0';
    Ones[0x4b] = '\0';
    Ones[0x4c] = '\0';
    Ones[0x4d] = '\0';
    Ones[0x4e] = '\0';
    Ones[0x4f] = '\0';
    Ones[0x30] = '\0';
    Ones[0x31] = '\0';
    Ones[0x32] = '\0';
    Ones[0x33] = '\0';
    Ones[0x34] = '\0';
    Ones[0x35] = '\0';
    Ones[0x36] = '\0';
    Ones[0x37] = '\0';
    Ones[0x38] = '\0';
    Ones[0x39] = '\0';
    Ones[0x3a] = '\0';
    Ones[0x3b] = '\0';
    Ones[0x3c] = '\0';
    Ones[0x3d] = '\0';
    Ones[0x3e] = '\0';
    Ones[0x3f] = '\0';
    Ones[0x20] = '\0';
    Ones[0x21] = '\0';
    Ones[0x22] = '\0';
    Ones[0x23] = '\0';
    Ones[0x24] = '\0';
    Ones[0x25] = '\0';
    Ones[0x26] = '\0';
    Ones[0x27] = '\0';
    Ones[0x28] = '\0';
    Ones[0x29] = '\0';
    Ones[0x2a] = '\0';
    Ones[0x2b] = '\0';
    Ones[0x2c] = '\0';
    Ones[0x2d] = '\0';
    Ones[0x2e] = '\0';
    Ones[0x2f] = '\0';
    Ones[0x10] = '\0';
    Ones[0x11] = '\0';
    Ones[0x12] = '\0';
    Ones[0x13] = '\0';
    Ones[0x14] = '\0';
    Ones[0x15] = '\0';
    Ones[0x16] = '\0';
    Ones[0x17] = '\0';
    Ones[0x18] = '\0';
    Ones[0x19] = '\0';
    Ones[0x1a] = '\0';
    Ones[0x1b] = '\0';
    Ones[0x1c] = '\0';
    Ones[0x1d] = '\0';
    Ones[0x1e] = '\0';
    Ones[0x1f] = '\0';
    Ones[0] = '\0';
    Ones[1] = '\0';
    Ones[2] = '\0';
    Ones[3] = '\0';
    Ones[4] = '\0';
    Ones[5] = '\0';
    Ones[6] = '\0';
    Ones[7] = '\0';
    Ones[8] = '\0';
    Ones[9] = '\0';
    Ones[10] = '\0';
    Ones[0xb] = '\0';
    Ones[0xc] = '\0';
    Ones[0xd] = '\0';
    Ones[0xe] = '\0';
    Ones[0xf] = '\0';
    Ones[0x60] = '\0';
    Ones[0x61] = '\0';
    Ones[0x62] = '\0';
    Ones[99] = '\0';
    for (uVar6 = 0; nVars + 1U != uVar6; uVar6 = uVar6 + 1) {
      Ones[uVar6] = (uVar18 >> ((uint)uVar6 & 0x1f) & 1) != 0 | 0x30;
    }
    if (fVerbose != 0) {
      printf("%s : ",Ones);
    }
    pFun = (word *)calloc((long)iVar15,8);
    sVar7 = strlen(Ones);
    if (nVars + 1U != (uint)sVar7) {
      __assert_fail("(int)strlen(pOnes) == nVars + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0xdad,"word *Abc_TtSymFunGenerate(char *, int)");
    }
    for (uVar5 = 0; uVar5 >> (bVar2 & 0x1f) == 0; uVar5 = uVar5 + 1) {
      uVar14 = 0 >> (bVar2 & 0x1f);
      for (uVar11 = 0; nVars != uVar11; uVar11 = uVar11 + 1) {
        uVar14 = uVar14 + ((uVar5 >> (uVar11 & 0x1f) & 1) != 0);
      }
      if (Ones[uVar14] == '1') {
        pFun[uVar5 >> 6] = pFun[uVar5 >> 6] ^ 1L << ((byte)uVar5 & 0x3f);
      }
    }
    if ((uint)nVars < 6) {
      uVar5 = ((uint)*pFun & 3) * 5;
      if (nVars != 1) {
        uVar5 = (uint)*pFun;
      }
      uVar11 = (uVar5 & 0xf) * 0x11;
      if (iVar4 != 2) {
        uVar11 = uVar5;
      }
      uVar5 = (uVar11 & 0xff) * 0x101;
      if (iVar13 != 3) {
        uVar5 = uVar11;
      }
      uVar11 = (uVar5 & 0xffff) * 0x10001;
      if (1 < iVar13 - 3U) {
        uVar11 = uVar5;
      }
      *pFun = (ulong)uVar11 * 0x100000001;
    }
    if (fVerbose != 0) {
      Extra_PrintHex(_stdout,(uint *)pFun,nVars);
    }
    Ntk_SymFunDeriveNpn(pFun,nVars,pComp);
    i = (int)local_130;
    if (p_00->nSize < i) {
      uVar5 = Abc_PrimeCudd(p_00->nSize * 2);
      Vec_IntGrow(p_00,uVar5);
      uVar6 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar6 = 0;
      }
      for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
        p_00->pArray[uVar12] = -1;
      }
      p_00->nSize = uVar5;
      p_01->nSize = 0;
      iVar16 = 0;
      uVar6 = 0;
      if (0 < i) {
        uVar6 = local_130;
      }
      while (((int)uVar6 != iVar16 && (pwVar8 = Vec_MemReadEntry(p,iVar16), pwVar8 != (word *)0x0)))
      {
        piVar9 = Vec_MemHashLookup(p,pwVar8);
        if (*piVar9 != -1) {
          __assert_fail("*pSpot == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                        ,0x16f,"void Vec_MemHashResize(Vec_Mem_t *)");
        }
        *piVar9 = p_01->nSize;
        Vec_IntPush(p_01,(int)pwVar8);
        iVar16 = iVar16 + 1;
      }
      if (i != p_01->nSize) {
        __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                      ,0x173,"void Vec_MemHashResize(Vec_Mem_t *)");
      }
    }
    pwVar8 = pFun;
    puVar10 = (uint *)Vec_MemHashLookup(p,pFun);
    if (*puVar10 == 0xffffffff) {
      *puVar10 = p_01->nSize;
      Vec_IntPush(p_01,(int)pwVar8);
      if (i < 0) {
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                      ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
      }
      iVar16 = (int)(local_130 >> 0xc);
      if (local_128 < iVar16) {
        if (iVar1 <= iVar16) {
          iVar3 = iVar1 * 2;
          bVar19 = iVar1 != 0;
          iVar1 = iVar16 + 0x20;
          if (bVar19) {
            iVar1 = iVar3;
          }
          p->nPageAlloc = iVar1;
          if (local_110 == (word **)0x0) {
            local_110 = (word **)malloc((long)iVar1 * 8);
          }
          else {
            local_110 = (word **)realloc(local_110,(long)iVar1 * 8);
          }
          p->ppPages = local_110;
          local_d0 = local_110;
        }
        for (lVar17 = (long)local_128; lVar17 < (long)(local_130 >> 0xc); lVar17 = lVar17 + 1) {
          pwVar8 = (word *)malloc((long)(iVar15 << 0xc) << 3);
          local_d0[lVar17 + 1] = pwVar8;
          local_110 = local_d0;
        }
        p->iPage = iVar16;
        local_128 = iVar16;
      }
      uVar5 = i + 1;
      uVar6 = (ulong)uVar5;
      p->nEntries = uVar5;
      pwVar8 = Vec_MemReadEntry(p,i);
      memmove(pwVar8,pFun,(long)iVar15 * 8);
      if (uVar5 != p_01->nSize) {
        __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                      ,0x180,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
      }
    }
    else {
      uVar6 = local_130;
      local_130 = (ulong)*puVar10;
    }
    if (fVerbose != 0) {
      printf(" : NPN ");
      Extra_PrintHex(_stdout,(uint *)pFun,nVars);
      printf("  Class %3d",local_130);
      putchar(10);
    }
    free(pFun);
    uVar18 = uVar18 + 1;
    local_130 = uVar6;
  } while( true );
}

Assistant:

void Ntk_SymFunGenerate( int nVars, int fVerbose )
{
    int k, m, Class;
    int * pComp = Extra_GreyCodeSchedule( nVars );
    Vec_Mem_t * vTtMem = Vec_MemAlloc( Abc_Truth6WordNum(nVars), 12 );
    Vec_MemHashAlloc( vTtMem, 10000 );
    assert( !(nVars < 1 || nVars > 16) );
    printf( "Generating truth tables of all symmetric functions of %d variables.\n", nVars );
    for ( m = 0; m < (1 << (nVars+1)); m++ )
    {
        word * pFun;
        char Ones[100] = {0};
        for ( k = 0; k <= nVars; k++ )
            Ones[k] = '0' + ((m >> k) & 1);
        if ( fVerbose )
            printf( "%s : ", Ones );
        pFun = Abc_TtSymFunGenerate( Ones, nVars );
        if ( nVars < 6 )
            pFun[0] = Abc_Tt6Stretch( pFun[0], nVars );
        if ( fVerbose )
            Extra_PrintHex( stdout, (unsigned *)pFun, nVars );
        Ntk_SymFunDeriveNpn( pFun, nVars, pComp );
        Class = Vec_MemHashInsert( vTtMem, pFun );
        if ( fVerbose )
        {
            printf( " : NPN " );
            Extra_PrintHex( stdout, (unsigned *)pFun, nVars );
            printf( "  Class %3d", Class );
            printf( "\n" );
        }
        ABC_FREE( pFun );
    }
    printf( "The number of different NPN classes is %d.\n", Vec_MemEntryNum(vTtMem) );
    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );
    ABC_FREE( pComp );
}